

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binding_map.cpp
# Opt level: O3

void __thiscall
r_exec::ObjectValue::valuate
          (ObjectValue *this,Code *destination,uint16_t write_index,uint16_t *extent_index)

{
  int iVar1;
  undefined4 extraout_var;
  undefined2 in_register_00000012;
  Atom local_1c [4];
  
  (*(destination->super__Object)._vptr__Object[10])(destination);
  r_code::Atom::RPointer((ushort)local_1c);
  iVar1 = (*(destination->super__Object)._vptr__Object[4])
                    (destination,(ulong)CONCAT22(in_register_00000012,write_index));
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),local_1c);
  r_code::Atom::~Atom(local_1c);
  (*(destination->super__Object)._vptr__Object[0x19])(destination,(this->object).object);
  return;
}

Assistant:

void ObjectValue::valuate(Code *destination, uint16_t write_index, uint16_t &extent_index) const
{
    destination->code(write_index) = Atom::RPointer(destination->references_size());
    destination->add_reference(object);
}